

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDual.cpp
# Opt level: O0

void __thiscall HDual::solve_phase1(HDual *this)

{
  char *pcVar1;
  HDual *in_RDI;
  double dVar2;
  HModel *this_00;
  HDual *unaff_retaddr;
  int lc_totalTime_rp_n;
  double lc_totalTime;
  char *in_stack_ffffffffffffffc8;
  char *message;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int iVar3;
  int in_stack_ffffffffffffffec;
  int phase;
  HModel *in_stack_fffffffffffffff0;
  
  HModel::util_reportMessage
            ((HModel *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
             in_stack_ffffffffffffffc8);
  HModel::initBound(in_stack_fffffffffffffff0,in_stack_ffffffffffffffec);
  HModel::initValue((HModel *)0x148684);
  HTimer::getTime((HTimer *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  phase = 0;
  do {
    rebuild(unaff_retaddr);
    do {
      iVar3 = in_RDI->dual_variant;
      if (iVar3 == 0) {
LAB_001486f6:
        iterate((HDual *)CONCAT44(iVar3,in_stack_ffffffffffffffd0));
      }
      else if (iVar3 == 1) {
        iterate_tasks((HDual *)CONCAT44(1,in_stack_ffffffffffffffd0));
      }
      else {
        if (iVar3 != 2) goto LAB_001486f6;
        iterate_multi((HDual *)CONCAT44(2,in_stack_ffffffffffffffd0));
      }
    } while (in_RDI->invertHint == 0);
    message = (char *)in_RDI->model->totalTime;
    dVar2 = HTimer::getTime((HTimer *)CONCAT44(iVar3,in_stack_ffffffffffffffd0));
    this_00 = (HModel *)((double)message + dVar2);
    phase = phase + 1;
    if (in_RDI->TimeLimitValue <= (double)this_00 && (double)this_00 != in_RDI->TimeLimitValue) {
      in_RDI->SolveBailout = true;
      in_RDI->model->problemStatus = 6;
      goto LAB_001487ae;
    }
    if (in_RDI->model->mlFg_haveFreshRebuild != 0) {
LAB_001487ae:
      if ((in_RDI->SolveBailout & 1U) == 0) {
        if (in_RDI->rowOut == -1) {
          pcVar1 = "dual-phase-1-optimal";
          HModel::util_reportMessage((HModel *)CONCAT44(iVar3,in_stack_ffffffffffffffd0),message);
          dVar2 = in_RDI->model->objective;
          if ((dVar2 != 0.0) || (NAN(dVar2))) {
            if (in_RDI->model->problemPerturbed == 0) {
              in_RDI->solvePhase = -1;
              HModel::util_reportMessage
                        ((HModel *)CONCAT44(iVar3,in_stack_ffffffffffffffd0),message);
              HModel::setProblemStatus(in_RDI->model,2);
            }
            else {
              cleanup(in_RDI,(EVP_PKEY_CTX *)pcVar1);
              if (in_RDI->dualInfeasCount == 0) {
                in_RDI->solvePhase = 2;
              }
            }
          }
          else {
            in_RDI->solvePhase = 2;
          }
        }
        else if (in_RDI->columnIn == -1) {
          pcVar1 = "dual-phase-1-unbounded";
          HModel::util_reportMessage((HModel *)CONCAT44(iVar3,in_stack_ffffffffffffffd0),message);
          if (in_RDI->model->problemPerturbed == 0) {
            in_RDI->solvePhase = -1;
            HModel::util_reportMessage((HModel *)CONCAT44(iVar3,in_stack_ffffffffffffffd0),message);
            HModel::setProblemStatus(in_RDI->model,4);
          }
          else {
            cleanup(in_RDI,(EVP_PKEY_CTX *)pcVar1);
            if (in_RDI->dualInfeasCount == 0) {
              in_RDI->solvePhase = 2;
            }
          }
        }
        if (in_RDI->solvePhase == 2) {
          HModel::initBound(this_00,phase);
          HModel::initValue((HModel *)0x14894d);
        }
      }
      return;
    }
  } while( true );
}

Assistant:

void HDual::solve_phase1() {
	model->util_reportMessage("dual-phase-1-start");
	// Switch to dual phase 1 bounds
	model->initBound(1);
	model->initValue();
	double lc_totalTime = model->totalTime + model->timer.getTime();
#ifdef JAJH_dev
	int lc_totalTime_rp_n = 0;
	//	printf("DualPh1: lc_totalTime = %5.2f; Record %d\n", lc_totalTime, lc_totalTime_rp_n);
#endif
	// Main solving structure
	for (;;) {
		rebuild();
		for (;;) {
			switch (dual_variant) {
			default:
			case HDUAL_VARIANT_PLAIN:
				iterate();
				break;
			case HDUAL_VARIANT_TASKS:
				iterate_tasks();
				break;
			case HDUAL_VARIANT_MULTI:
				iterate_multi();
				break;
			}
			if (invertHint)
				break;
			//printf("HDual::solve_phase1: Iter = %d; Objective = %g\n", model->numberIteration, model->objective);
			/*			if (model->objective > model->dblOption[DBLOPT_OBJ_UB]) {
#ifdef SCIP_dev
			  printf("HDual::solve_phase1: %g = Objective > dblOption[DBLOPT_OBJ_UB]\n", model->objective, model->dblOption[DBLOPT_OBJ_UB]);
#endif
			  model->problemStatus = LP_Status_ObjUB; 
                          break;
			}
			*/
		}
		lc_totalTime = model->totalTime + model->timer.getTime();
#ifdef JAJH_dev
		lc_totalTime_rp_n += 1;
		//		printf("DualPh1: lc_totalTime = %5.2f; Record %d\n", lc_totalTime, lc_totalTime_rp_n);
#endif
		if (lc_totalTime > TimeLimitValue) {
		  SolveBailout = true;
		  model->problemStatus = LP_Status_OutOfTime;
		  break;
		}
		// If the data are fresh from rebuild(), break out of
		// the outer loop to see what's ocurred
		// Was:	if (model->countUpdate == 0) break;
		if (model->mlFg_haveFreshRebuild) break;
	}

	if (SolveBailout) return;

	if (rowOut == -1) {
		model->util_reportMessage("dual-phase-1-optimal");
		// Go to phase 2
		if (model->objective == 0) {
			solvePhase = 2;
		} else {
			// We still have dual infeasible
			if (model->problemPerturbed) {
				// Clean up perturbation and go on
				cleanup();
				if (dualInfeasCount == 0)
					solvePhase = 2;
			} else {
				// Report dual infeasible
				solvePhase = -1;
				model->util_reportMessage("dual-infeasible");
				model->setProblemStatus(LP_Status_Unbounded);
			}
		}
	} else if (columnIn == -1) {
		// We got dual phase 1 unbounded - strange
		model->util_reportMessage("dual-phase-1-unbounded");
		if (model->problemPerturbed) {
			// Clean up perturbation and go on
			cleanup();
			if (dualInfeasCount == 0)
				solvePhase = 2;
		} else {
			// Report strange issues
			solvePhase = -1;
			model->util_reportMessage("dual-phase-1-not-solved");
			model->setProblemStatus(LP_Status_Failed);
		}
	}

	if (solvePhase == 2) {
		model->initBound();
		model->initValue();
	}

}